

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O1

void __thiscall MyPictureDescriptor::MyDump(MyPictureDescriptor *this,FILE *stream)

{
  uint uVar1;
  long lVar2;
  ILogSink *this_00;
  JPEG2000PictureSubDescriptor *pJVar3;
  CDCIEssenceDescriptor *pCVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  ImageComponent_t image_components [3];
  CodingStyleDefault_t coding_style_default;
  undefined8 local_68;
  undefined1 local_60;
  byte local_5a;
  byte local_59;
  ushort local_58;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  byte local_50 [32];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  pCVar4 = this->m_CDCIDescriptor;
  if ((pCVar4 != (CDCIEssenceDescriptor *)0x0) ||
     (pCVar4 = (CDCIEssenceDescriptor *)this->m_RGBADescriptor,
     pCVar4 != (CDCIEssenceDescriptor *)0x0)) {
    (**(code **)(*(long *)pCVar4 + 0x88))(pCVar4,stream);
    pJVar3 = this->m_JP2KSubDescriptor;
    if (pJVar3 == (JPEG2000PictureSubDescriptor *)0x0) {
      return;
    }
    (**(code **)(*(long *)pJVar3 + 0x88))(pJVar3,stream);
    fprintf((FILE *)stream,"    ImageComponents: (max=%d)\n",3);
    uVar1 = *(uint *)(this->m_JP2KSubDescriptor + 0xdc);
    if (uVar1 == 0x11) {
      lVar2 = *(long *)(this->m_JP2KSubDescriptor + 0xd0);
      if (lVar2 == 0) goto LAB_0010da0f;
      local_60 = *(undefined1 *)(lVar2 + 0x10);
      local_68 = *(undefined8 *)(lVar2 + 8);
    }
    else {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn
                (this_00,"Unexpected PictureComponentSizing size: %u, should be 17.\n",(ulong)uVar1)
      ;
    }
    fwrite("  bits  h-sep v-sep\n",0x14,1,(FILE *)stream);
    pJVar3 = this->m_JP2KSubDescriptor;
    if (*(short *)(pJVar3 + 0xc4) != 0) {
      pbVar5 = (byte *)((long)&local_68 + 2);
      uVar6 = 0;
      do {
        fprintf((FILE *)stream,"  %4d  %5d %5d\n",(ulong)(pbVar5[-2] + 1),(ulong)pbVar5[-1],
                (ulong)*pbVar5);
        pJVar3 = this->m_JP2KSubDescriptor;
        if (1 < uVar6) break;
        uVar6 = uVar6 + 1;
        pbVar5 = pbVar5 + 3;
      } while (uVar6 < *(ushort *)(pJVar3 + 0xc4));
    }
    if (*(void **)(pJVar3 + 0xf0) == (void *)0x0) {
LAB_0010da0f:
      __assert_fail("m_Data",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                    ,0x221,"const byte_t *Kumu::ByteString::RoData() const");
    }
    memcpy(&local_5a,*(void **)(pJVar3 + 0xf0),(ulong)*(uint *)(pJVar3 + 0xfc));
    uVar6 = 0;
    fprintf((FILE *)stream,"               Scod: %hhu\n",(ulong)local_5a);
    fprintf((FILE *)stream,"   ProgressionOrder: %hhu\n",(ulong)local_59);
    fprintf((FILE *)stream,"     NumberOfLayers: %hd\n",
            (ulong)(ushort)(local_58 << 8 | local_58 >> 8));
    fprintf((FILE *)stream," MultiCompTransform: %hhu\n",(ulong)local_56);
    fprintf((FILE *)stream,"DecompositionLevels: %hhu\n",(ulong)local_55);
    fprintf((FILE *)stream,"     CodeblockWidth: %hhu\n",(ulong)local_54);
    fprintf((FILE *)stream,"    CodeblockHeight: %hhu\n",(ulong)local_53);
    fprintf((FILE *)stream,"     CodeblockStyle: %hhu\n",(ulong)local_52);
    fprintf((FILE *)stream,"     Transformation: %hhu\n",(ulong)local_51);
    if (local_50[0] != 0) {
      uVar7 = 0;
      do {
        uVar6 = uVar7 + 1;
        if (0x1e < uVar7) break;
        lVar2 = uVar7 + 1;
        uVar7 = uVar6;
      } while (local_50[lVar2] != 0);
    }
    fprintf((FILE *)stream,"          Precincts: %u\n",uVar6 & 0xffffffff);
    fwrite("precinct dimensions:\n",0x15,1,(FILE *)stream);
    if ((int)uVar6 != 0) {
      uVar7 = 0;
      do {
        pbVar5 = local_50 + uVar7;
        uVar7 = uVar7 + 1;
        fprintf((FILE *)stream,"    %d: %d x %d\n",uVar7 & 0xffffffff,
                (ulong)(uint)s_exp_lookup[*pbVar5 & 0xf],(ulong)(uint)s_exp_lookup[*pbVar5 >> 4]);
      } while ((uVar6 & 0xffffffff) != uVar7);
    }
  }
  return;
}

Assistant:

void MyDump(FILE* stream) {
    if ( stream == 0 )
      {
	stream = stderr;
      }

    if ( m_CDCIDescriptor != 0 )
      {
	m_CDCIDescriptor->Dump(stream);
      }
    else if ( m_RGBADescriptor != 0 )
      {
	m_RGBADescriptor->Dump(stream);
      }
    else
      {
	return;
      }

    if ( m_JP2KSubDescriptor != 0 )
      {
	m_JP2KSubDescriptor->Dump(stream);

	fprintf(stream, "    ImageComponents: (max=%d)\n", JP2K::MaxComponents);

	//
	ui32_t component_sizing = m_JP2KSubDescriptor->PictureComponentSizing.const_get().Length();
	JP2K::ImageComponent_t image_components[JP2K::MaxComponents];

	if ( component_sizing == 17 ) // ( 2 * sizeof(ui32_t) ) + 3 components * 3 byte each
	  {
	    memcpy(&image_components,
		   m_JP2KSubDescriptor->PictureComponentSizing.const_get().RoData() + 8,
		   component_sizing - 8);
	  }
	else
	  {
	    DefaultLogSink().Warn("Unexpected PictureComponentSizing size: %u, should be 17.\n", component_sizing);
	  }

	fprintf(stream, "  bits  h-sep v-sep\n");

	for ( int i = 0; i < m_JP2KSubDescriptor->Csize && i < JP2K::MaxComponents; i++ )
	  {
	    fprintf(stream, "  %4d  %5d %5d\n",
		    image_components[i].Ssize + 1, // See ISO 15444-1, Table A11, for the origin of '+1'
		    image_components[i].XRsize,
		    image_components[i].YRsize
		    );
	  }

	//
	JP2K::CodingStyleDefault_t coding_style_default;

	memcpy(&coding_style_default,
	       m_JP2KSubDescriptor->CodingStyleDefault.const_get().RoData(),
	       m_JP2KSubDescriptor->CodingStyleDefault.const_get().Length());

	fprintf(stream, "               Scod: %hhu\n", coding_style_default.Scod);
	fprintf(stream, "   ProgressionOrder: %hhu\n", coding_style_default.SGcod.ProgressionOrder);
	fprintf(stream, "     NumberOfLayers: %hd\n",
		KM_i16_BE(Kumu::cp2i<ui16_t>(coding_style_default.SGcod.NumberOfLayers)));
    
	fprintf(stream, " MultiCompTransform: %hhu\n", coding_style_default.SGcod.MultiCompTransform);
	fprintf(stream, "DecompositionLevels: %hhu\n", coding_style_default.SPcod.DecompositionLevels);
	fprintf(stream, "     CodeblockWidth: %hhu\n", coding_style_default.SPcod.CodeblockWidth);
	fprintf(stream, "    CodeblockHeight: %hhu\n", coding_style_default.SPcod.CodeblockHeight);
	fprintf(stream, "     CodeblockStyle: %hhu\n", coding_style_default.SPcod.CodeblockStyle);
	fprintf(stream, "     Transformation: %hhu\n", coding_style_default.SPcod.Transformation);
    
	ui32_t precinct_set_size = 0;

	for ( int i = 0; coding_style_default.SPcod.PrecinctSize[i] != 0 && i < JP2K::MaxPrecincts; ++i )
	  {
	    ++precinct_set_size;
	  }

	fprintf(stream, "          Precincts: %u\n", precinct_set_size);
	fprintf(stream, "precinct dimensions:\n");

	for ( unsigned int i = 0; i < precinct_set_size && i < JP2K::MaxPrecincts; i++ )
	  fprintf(stream, "    %d: %d x %d\n", i + 1,
		  s_exp_lookup[coding_style_default.SPcod.PrecinctSize[i]&0x0f],
		  s_exp_lookup[(coding_style_default.SPcod.PrecinctSize[i]>>4)&0x0f]
		  );
      }
  }